

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O3

int OpenFiles(Context *context)

{
  int __fd;
  FILE *pFVar1;
  
  context->fin = (FILE *)0x0;
  if (context->current_input_path == (char *)0x0) {
    pFVar1 = fdopen(0,"rb");
    context->fin = (FILE *)pFVar1;
  }
  else {
    pFVar1 = fopen(context->current_input_path,"rb");
    context->fin = (FILE *)pFVar1;
    if (pFVar1 == (FILE *)0x0) {
      OpenFiles_cold_1();
      return 0;
    }
  }
  if (context->test_integrity == 0) {
    context->fout = (FILE *)0x0;
    if (context->current_output_path == (char *)0x0) {
      pFVar1 = fdopen(1,"wb");
      context->fout = (FILE *)pFVar1;
      return 1;
    }
    __fd = open(context->current_output_path,(uint)(context->force_overwrite == 0) << 7 | 0x241,
                0x180);
    if (__fd < 0) {
      OpenFiles_cold_3();
    }
    else {
      pFVar1 = fdopen(__fd,"wb");
      context->fout = (FILE *)pFVar1;
      if (pFVar1 != (FILE *)0x0) {
        return 1;
      }
      OpenFiles_cold_2();
    }
    return 0;
  }
  return 1;
}

Assistant:

static BROTLI_BOOL OpenFiles(Context* context) {
  BROTLI_BOOL is_ok = OpenInputFile(context->current_input_path, &context->fin);
  if (!context->test_integrity && is_ok) {
    is_ok = OpenOutputFile(
        context->current_output_path, &context->fout, context->force_overwrite);
  }
  return is_ok;
}